

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O2

int __thiscall
QtMWidgets::NavigationButtonPrivate::init(NavigationButtonPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  QPalette *this_00;
  QColor *pQVar4;
  
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  QWidget::setBackgroundRole((ColorRole)this->q);
  this_00 = (QPalette *)QWidget::palette();
  pQVar4 = QPalette::color(this_00,Highlight);
  uVar2 = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->baseColor = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->baseColor).ct + 2) = uVar2;
  uVar2 = *(undefined8 *)pQVar4;
  uVar1 = *(undefined4 *)((long)&pQVar4->ct + 4);
  (this->color).ct.argb.pad = (pQVar4->ct).argb.pad;
  *(undefined4 *)((long)&(this->color).ct + 4) = uVar1;
  *(undefined8 *)&this->color = uVar2;
  uVar2 = *(undefined8 *)&this->baseColor;
  uVar3 = *(undefined8 *)((long)&(this->baseColor).ct + 2);
  *(undefined8 *)&this->textColor = uVar2;
  *(undefined8 *)((long)&(this->textColor).ct + 2) = uVar3;
  return (int)uVar2;
}

Assistant:

void
NavigationButtonPrivate::init()
{
	q->setSizePolicy( QSizePolicy::Expanding, QSizePolicy::Fixed );
	q->setAutoFillBackground( true );
	q->setBackgroundRole( QPalette::Base );

	baseColor = q->palette().color( QPalette::Highlight );
	color = baseColor;
	textColor = baseColor;
}